

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniFB_GL.c
# Opt level: O0

void resize_GL(SWindowData *window_data)

{
  long in_RDI;
  
  if ((*(byte *)(in_RDI + 0x2a1) & 1) != 0) {
    glViewport(0,0,*(undefined4 *)(in_RDI + 0x48),*(undefined4 *)(in_RDI + 0x4c));
    glMatrixMode(0x1701);
    glLoadIdentity();
    glOrtho(0,(double)*(uint *)(in_RDI + 0x48),(double)*(uint *)(in_RDI + 0x4c),0,0x40a0000000000000
            ,0xc0a0000000000000);
    glClear(0x4000);
  }
  return;
}

Assistant:

void 
resize_GL(SWindowData *window_data) {
    if(window_data->is_initialized) {
        glViewport(0, 0, window_data->window_width, window_data->window_height);

        glMatrixMode(GL_PROJECTION);
        glLoadIdentity();
        glOrtho(0, window_data->window_width, window_data->window_height, 0, 2048, -2048);

        glClear(GL_COLOR_BUFFER_BIT);
    }
}